

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HouseholderSequence.h
# Opt level: O0

void __thiscall
Eigen::HouseholderSequence<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,1>
::evalTo<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>>
          (HouseholderSequence<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,1>
           *this,Matrix<double,__1,__1,_0,__1,__1> *dst,Matrix<double,__1,_1,_0,__1,_1> *workspace)

{
  long lVar1;
  Matrix<double,__1,_1,_0,__1,_1> *this_00;
  Index IVar2;
  Scalar *pSVar3;
  Scalar *pSVar4;
  Scalar *pSVar5;
  Scalar *pSVar6;
  Index nbCols;
  EssentialVectorType local_290;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> local_268;
  EssentialVectorType local_240;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> local_218;
  long local_1f0;
  Index cornerSize_1;
  Index k_2;
  SegmentReturnType local_1b8;
  long local_170;
  Index k_1;
  SegmentReturnType local_140;
  EssentialVectorType local_f8;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> local_d0;
  EssentialVectorType local_a8;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> local_80;
  long local_58;
  Index cornerSize;
  Index k;
  DiagonalReturnType local_40;
  Scalar *local_30;
  Scalar *dst_data;
  Index vecs;
  Matrix<double,__1,_1,_0,__1,_1> *workspace_local;
  Matrix<double,__1,__1,_0,__1,__1> *dst_local;
  HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
  *this_local;
  
  vecs = (Index)workspace;
  workspace_local = (Matrix<double,__1,_1,_0,__1,_1> *)dst;
  dst_local = (Matrix<double,__1,__1,_0,__1,__1> *)this;
  IVar2 = HouseholderSequence<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
          ::rows((HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                  *)this);
  PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&workspace->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,IVar2);
  dst_data = *(Scalar **)(this + 0x18);
  pSVar3 = internal::extract_data<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                     ((Matrix<double,__1,__1,_0,__1,__1> *)workspace_local);
  local_30 = pSVar3;
  if ((pSVar3 == (Scalar *)0x0) ||
     (pSVar4 = internal::extract_data<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                         (*(Matrix<double,__1,__1,_0,__1,__1> **)this), pSVar3 != pSVar4)) {
    this_00 = workspace_local;
    IVar2 = HouseholderSequence<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
            ::rows((HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                    *)this);
    nbCols = HouseholderSequence<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
             ::rows((HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                     *)this);
    MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setIdentity
              ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this_00,IVar2,nbCols);
    cornerSize_1 = (Index)dst_data;
    while (cornerSize_1 = cornerSize_1 + -1, -1 < cornerSize_1) {
      IVar2 = HouseholderSequence<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
              ::rows((HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                      *)this);
      local_1f0 = (IVar2 - cornerSize_1) - *(long *)(this + 0x20);
      if (((byte)this[0x10] & 1) == 0) {
        DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::bottomRightCorner
                  (&local_268,
                   (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)workspace_local,local_1f0
                   ,local_1f0);
        HouseholderSequence<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
        ::essentialVector(&local_290,
                          (HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                           *)this,cornerSize_1);
        pSVar5 = PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::coeff
                           (*(PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> **)(this + 8)
                            ,cornerSize_1);
        pSVar6 = PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::coeffRef
                           ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)vecs,0);
        MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>>::
        applyHouseholderOnTheLeft<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,false>>
                  ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>> *)
                   &local_268,&local_290,pSVar5,pSVar6);
      }
      else {
        DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::bottomRightCorner
                  (&local_218,
                   (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)workspace_local,local_1f0
                   ,local_1f0);
        HouseholderSequence<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
        ::essentialVector(&local_240,
                          (HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                           *)this,cornerSize_1);
        pSVar5 = PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::coeff
                           (*(PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> **)(this + 8)
                            ,cornerSize_1);
        pSVar6 = PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::coeffRef
                           ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)vecs,0);
        MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>>::
        applyHouseholderOnTheRight<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,false>>
                  ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>> *)
                   &local_218,&local_240,pSVar5,pSVar6);
      }
    }
  }
  else {
    MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::diagonal
              (&local_40,(MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)workspace_local);
    DenseBase<Eigen::Diagonal<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>_>::setOnes
              ((DenseBase<Eigen::Diagonal<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_> *)&local_40
              );
    k = (Index)MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::triangularView<10u>
                         ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)workspace_local);
    TriangularView<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_10U>::setZero
              ((TriangularView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_10U> *)&k);
    cornerSize = (Index)dst_data;
    while (cornerSize = cornerSize + -1, -1 < cornerSize) {
      IVar2 = HouseholderSequence<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
              ::rows((HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                      *)this);
      local_58 = (IVar2 - cornerSize) - *(long *)(this + 0x20);
      if (((byte)this[0x10] & 1) == 0) {
        DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::bottomRightCorner
                  (&local_d0,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)workspace_local
                   ,local_58,local_58);
        HouseholderSequence<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
        ::essentialVector(&local_f8,
                          (HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                           *)this,cornerSize);
        pSVar5 = PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::coeff
                           (*(PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> **)(this + 8)
                            ,cornerSize);
        pSVar6 = PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::data
                           ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)vecs);
        MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>>::
        applyHouseholderOnTheLeft<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,false>>
                  ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>> *)
                   &local_d0,&local_f8,pSVar5,pSVar6);
      }
      else {
        DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::bottomRightCorner
                  (&local_80,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)workspace_local
                   ,local_58,local_58);
        HouseholderSequence<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
        ::essentialVector(&local_a8,
                          (HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                           *)this,cornerSize);
        pSVar5 = PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::coeff
                           (*(PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> **)(this + 8)
                            ,cornerSize);
        pSVar6 = PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::data
                           ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)vecs);
        MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>>::
        applyHouseholderOnTheRight<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,false>>
                  ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>> *)
                   &local_80,&local_a8,pSVar5,pSVar6);
      }
      DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                ((ColXpr *)&k_1,
                 (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)workspace_local,cornerSize)
      ;
      IVar2 = HouseholderSequence<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
              ::rows((HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                      *)this);
      DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::tail
                (&local_140,
                 (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)
                 &k_1,(IVar2 - cornerSize) + -1);
      DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_false>_>
      ::setZero((DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>_>
                 *)&local_140);
    }
    for (local_170 = 0; lVar1 = local_170,
        IVar2 = HouseholderSequence<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
                ::cols((HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                        *)this), lVar1 < IVar2 - (long)dst_data; local_170 = local_170 + 1) {
      DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                ((ColXpr *)&k_2,
                 (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)workspace_local,local_170);
      IVar2 = HouseholderSequence<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
              ::rows((HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                      *)this);
      DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::tail
                (&local_1b8,
                 (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)
                 &k_2,(IVar2 - local_170) + -1);
      DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_false>_>
      ::setZero((DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>_>
                 *)&local_1b8);
    }
  }
  return;
}

Assistant:

void evalTo(Dest& dst, Workspace& workspace) const
    {
      workspace.resize(rows());
      Index vecs = m_length;
      const typename Dest::Scalar *dst_data = internal::extract_data(dst);
      if(    internal::is_same<typename internal::remove_all<VectorsType>::type,Dest>::value
          && dst_data!=0 && dst_data == internal::extract_data(m_vectors))
      {
        // in-place
        dst.diagonal().setOnes();
        dst.template triangularView<StrictlyUpper>().setZero();
        for(Index k = vecs-1; k >= 0; --k)
        {
          Index cornerSize = rows() - k - m_shift;
          if(m_trans)
            dst.bottomRightCorner(cornerSize, cornerSize)
               .applyHouseholderOnTheRight(essentialVector(k), m_coeffs.coeff(k), workspace.data());
          else
            dst.bottomRightCorner(cornerSize, cornerSize)
               .applyHouseholderOnTheLeft(essentialVector(k), m_coeffs.coeff(k), workspace.data());

          // clear the off diagonal vector
          dst.col(k).tail(rows()-k-1).setZero();
        }
        // clear the remaining columns if needed
        for(Index k = 0; k<cols()-vecs ; ++k)
          dst.col(k).tail(rows()-k-1).setZero();
      }
      else
      {
        dst.setIdentity(rows(), rows());
        for(Index k = vecs-1; k >= 0; --k)
        {
          Index cornerSize = rows() - k - m_shift;
          if(m_trans)
            dst.bottomRightCorner(cornerSize, cornerSize)
               .applyHouseholderOnTheRight(essentialVector(k), m_coeffs.coeff(k), &workspace.coeffRef(0));
          else
            dst.bottomRightCorner(cornerSize, cornerSize)
               .applyHouseholderOnTheLeft(essentialVector(k), m_coeffs.coeff(k), &workspace.coeffRef(0));
        }
      }
    }